

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int whereLoopAddVirtual(WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUnusable)

{
  int *piVar1;
  byte bVar2;
  SrcList *pSVar3;
  ExprList *pEVar4;
  Parse *pParse;
  Expr *pEVar5;
  Bitmask mPrereq_00;
  WhereLoop *pWVar6;
  u8 uVar7;
  ushort uVar8;
  int iVar9;
  uint uVar10;
  sqlite3_index_info *psVar11;
  Select *pSVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  ExprList_item *pEVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  WhereTerm *pWVar21;
  ulong uVar22;
  u16 *puVar23;
  ushort uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  int bIn;
  uint local_88;
  int local_84;
  sqlite3_index_info *local_80;
  uint local_74;
  Parse *local_70;
  Bitmask local_68;
  WhereLoopBuilder *local_60;
  SrcList_item *local_58;
  uint local_4c;
  WhereLoop *local_48;
  ulong local_40;
  WhereClause *local_38;
  
  local_38 = pBuilder->pWC;
  pSVar3 = pBuilder->pWInfo->pTabList;
  local_48 = pBuilder->pNew;
  bVar2 = local_48->iTab;
  local_58 = pSVar3->a + bVar2;
  pEVar4 = pBuilder->pOrderBy;
  iVar14 = local_38->nTerm;
  iVar9 = 0;
  if (0 < iVar14) {
    puVar23 = &local_38->a->eOperator;
    iVar9 = 0;
    do {
      if ((*(int *)(puVar23 + 4) == pSVar3->a[bVar2].iCursor) &&
         ((*(ulong *)(puVar23 + 0xe) & mUnusable) == 0)) {
        iVar9 = (iVar9 + 1) - (uint)((*puVar23 & 0xf7ff) == 0);
      }
      puVar23 = puVar23 + 0x20;
      iVar14 = iVar14 + -1;
    } while (iVar14 != 0);
  }
  pParse = pBuilder->pWInfo->pParse;
  uVar27 = 0;
  if (pEVar4 != (ExprList *)0x0) {
    uVar13 = pEVar4->nExpr;
    uVar15 = 0;
    if (0 < (int)uVar13) {
      pEVar16 = pEVar4->a;
      uVar15 = 0;
      do {
        if ((pEVar16->pExpr->op != 0xa2) || (pEVar16->pExpr->iTable != pSVar3->a[bVar2].iCursor))
        goto LAB_0018a6d2;
        uVar15 = uVar15 + 1;
        pEVar16 = pEVar16 + 1;
      } while (uVar13 != uVar15);
      uVar15 = (ulong)uVar13;
    }
LAB_0018a6d2:
    uVar27 = 0;
    if ((uint)uVar15 == uVar13) {
      uVar27 = uVar13;
    }
  }
  lVar26 = (long)iVar9;
  local_70 = (Parse *)CONCAT44(local_70._4_4_,uVar27);
  local_60 = pBuilder;
  psVar11 = (sqlite3_index_info *)
            sqlite3DbMallocZero(pParse->db,(long)(int)uVar27 * 8 + lVar26 * 0x14 + 0x70);
  pWVar6 = local_48;
  if (psVar11 == (sqlite3_index_info *)0x0) {
    sqlite3ErrorMsg(pParse,"out of memory");
  }
  else {
    psVar11->nConstraint = iVar9;
    psVar11->nOrderBy = uVar27;
    psVar11->aConstraint = (sqlite3_index_constraint *)&psVar11[1].nOrderBy;
    psVar11->aOrderBy = (sqlite3_index_orderby *)(&psVar11[1].nOrderBy + lVar26 * 3);
    psVar11->aConstraintUsage =
         (sqlite3_index_constraint_usage *)
         ((sqlite3_index_orderby *)(&psVar11[1].nOrderBy + lVar26 * 3) + (int)uVar27);
    *(WhereClause **)(psVar11 + 1) = local_38;
    psVar11[1].aConstraint = (sqlite3_index_constraint *)pParse;
    uVar27 = local_38->nTerm;
    if ((int)uVar27 < 1) {
      local_88._0_2_ = 0;
    }
    else {
      pWVar21 = local_38->a;
      iVar14 = local_58->iCursor;
      uVar13 = 0;
      iVar9 = 0;
      local_88 = 0;
      do {
        if ((((pWVar21->leftCursor == iVar14) && ((pWVar21->prereqRight & mUnusable) == 0)) &&
            (uVar24 = pWVar21->eOperator, (uVar24 & 0xf7ff) != 0)) &&
           (((((local_58->fg).jointype & 8) == 0 || ((uVar24 & 0x180) == 0)) ||
            ((pWVar21->pExpr->flags & 1) != 0)))) {
          piVar1 = &psVar11[1].nOrderBy + (long)iVar9 * 3;
          *piVar1 = (pWVar21->u).leftColumn;
          piVar1[2] = uVar13;
          uVar24 = uVar24 & 0x1fff;
          uVar8 = uVar24;
          if (uVar24 == 1) {
            uVar8 = 2;
          }
          if (uVar8 == 0x40) {
            uVar7 = pWVar21->eMatchOp;
LAB_0018a813:
            *(u8 *)(piVar1 + 1) = uVar7;
          }
          else {
            if ((uVar8 & 0x180) != 0) {
              uVar7 = 'H' - (uVar8 == 0x100);
              goto LAB_0018a813;
            }
            *(char *)(piVar1 + 1) = (char)uVar8;
            if ((uVar8 & 0x3c) != 0) {
              pEVar5 = pWVar21->pExpr->pRight;
              uVar7 = pEVar5->op;
              if (uVar7 == 0xa8) {
                uVar7 = pEVar5->op2;
              }
              if (uVar7 == 0x83) {
                pSVar12 = (pEVar5->x).pSelect;
              }
              else {
                if (uVar7 != 0xa9) goto LAB_0018a817;
                pSVar12 = (Select *)&pEVar5->x;
              }
              if (1 < ((anon_union_8_2_a01b6dbf_for_x *)&pSVar12->pEList)->pList->nExpr) {
                uVar10 = 1 << ((byte)uVar13 & 0x1f);
                if (0xf < uVar13) {
                  uVar10 = 0;
                }
                local_88 = local_88 | uVar10;
                if (uVar24 == 0x10) {
                  uVar7 = '\b';
                }
                else {
                  if (uVar24 != 4) goto LAB_0018a817;
                  uVar7 = ' ';
                }
                goto LAB_0018a813;
              }
            }
          }
LAB_0018a817:
          iVar9 = iVar9 + 1;
        }
        uVar13 = uVar13 + 1;
        pWVar21 = pWVar21 + 1;
      } while (uVar27 != uVar13);
    }
    if (0 < (int)local_70) {
      pEVar16 = pEVar4->a;
      uVar15 = 0;
      do {
        (&psVar11[1].nOrderBy)[lVar26 * 3 + uVar15 * 2] = (int)pEVar16->pExpr->iColumn;
        (&psVar11[1].field_0x14)[uVar15 * 8 + lVar26 * 0xc] = pEVar16->sortOrder;
        uVar15 = uVar15 + 1;
        pEVar16 = pEVar16 + 1;
      } while (((ulong)local_70 & 0xffffffff) != uVar15);
    }
    local_48->rSetup = 0;
    local_48->wsFlags = 0x400;
    local_48->nLTerm = 0;
    (local_48->u).vtab.needFree = '\0';
    uVar27 = psVar11->nConstraint;
    local_80 = psVar11;
    local_68 = mPrereq;
    iVar14 = whereLoopResize(pParse->db,local_48,uVar27);
    if (iVar14 == 0) {
      local_70 = pParse;
      local_58 = (SrcList_item *)(ulong)uVar27;
      iVar14 = whereLoopAddVirtualOne
                         (local_60,local_68,0xffffffffffffffff,0,psVar11,(u16)local_88,&local_84);
      psVar11 = local_80;
      if (iVar14 == 0) {
        uVar28 = ~local_68;
        uVar15 = pWVar6->prereq & uVar28;
        iVar14 = 0;
        if (local_84 != 0 || uVar15 != 0) {
          if (local_84 == 0) {
            uVar25 = 0;
            local_74 = 0;
          }
          else {
            iVar14 = whereLoopAddVirtualOne
                               (local_60,local_68,0xffffffffffffffff,1,local_80,(u16)local_88,
                                &local_84);
            uVar25 = local_48->prereq & uVar28;
            psVar11 = local_80;
            if (iVar14 != 0) goto LAB_0018ab9a;
            local_74 = (uint)(uVar25 == 0);
          }
          mPrereq_00 = local_68;
          lVar26 = (long)local_58 * 0xc;
          uVar17 = 0;
          psVar11 = local_80;
          local_4c = local_74;
          local_40 = uVar25;
          do {
            if ((int)local_58 < 1) {
LAB_0018ab1b:
              iVar14 = 0;
              uVar27 = local_74;
              if ((local_4c == 0) &&
                 (iVar14 = whereLoopAddVirtualOne
                                     (local_60,local_68,local_68,0,psVar11,(u16)local_88,&local_84),
                 psVar11 = local_80, uVar27 = local_74, local_84 == 0)) {
                uVar27 = 1;
              }
              if (uVar27 == 0 && iVar14 == 0) {
                iVar14 = whereLoopAddVirtualOne
                                   (local_60,local_68,local_68,1,psVar11,(u16)local_88,&local_84);
                psVar11 = local_80;
              }
              break;
            }
            lVar20 = 0;
            uVar18 = 0xffffffffffffffff;
            do {
              uVar22 = local_38->a[*(int *)((long)&psVar11->aConstraint->iTermOffset + lVar20)].
                       prereqRight & uVar28;
              uVar19 = uVar18;
              if (uVar22 < uVar18) {
                uVar19 = uVar22;
              }
              if (uVar22 <= uVar17) {
                uVar19 = uVar18;
              }
              lVar20 = lVar20 + 0xc;
              uVar18 = uVar19;
            } while (lVar26 != lVar20);
            if (uVar19 == 0xffffffffffffffff) goto LAB_0018ab1b;
            iVar14 = 0;
            if ((((uVar19 != uVar15) && (uVar19 != uVar25)) &&
                (iVar14 = whereLoopAddVirtualOne
                                    (local_60,mPrereq_00,uVar19 | mPrereq_00,0,psVar11,(u16)local_88
                                     ,&local_84), psVar11 = local_80, uVar25 = local_40,
                local_48->prereq == mPrereq_00)) && (local_4c = 1, local_84 == 0)) {
              local_74 = 1;
            }
            uVar17 = uVar19;
          } while (iVar14 == 0);
        }
      }
LAB_0018ab9a:
      if (psVar11->needToFreeIdxStr != 0) {
        sqlite3_free(psVar11->idxStr);
        psVar11 = local_80;
      }
      sqlite3DbFreeNN(local_70->db,psVar11);
      return iVar14;
    }
    sqlite3DbFreeNN(pParse->db,psVar11);
  }
  return 7;
}

Assistant:

static int whereLoopAddVirtual(
  WhereLoopBuilder *pBuilder,  /* WHERE clause information */
  Bitmask mPrereq,             /* Tables that must be scanned before this one */
  Bitmask mUnusable            /* Tables that must be scanned after this one */
){
  int rc = SQLITE_OK;          /* Return code */
  WhereInfo *pWInfo;           /* WHERE analysis context */
  Parse *pParse;               /* The parsing context */
  WhereClause *pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc;   /* The FROM clause term to search */
  sqlite3_index_info *p;       /* Object to pass to xBestIndex() */
  int nConstraint;             /* Number of constraints in p */
  int bIn;                     /* True if plan uses IN(...) operator */
  WhereLoop *pNew;
  Bitmask mBest;               /* Tables used by best possible plan */
  u16 mNoOmit;

  assert( (mPrereq & mUnusable)==0 );
  pWInfo = pBuilder->pWInfo;
  pParse = pWInfo->pParse;
  pWC = pBuilder->pWC;
  pNew = pBuilder->pNew;
  pSrc = &pWInfo->pTabList->a[pNew->iTab];
  assert( IsVirtual(pSrc->pTab) );
  p = allocateIndexInfo(pParse, pWC, mUnusable, pSrc, pBuilder->pOrderBy, 
      &mNoOmit);
  if( p==0 ) return SQLITE_NOMEM_BKPT;
  pNew->rSetup = 0;
  pNew->wsFlags = WHERE_VIRTUALTABLE;
  pNew->nLTerm = 0;
  pNew->u.vtab.needFree = 0;
  nConstraint = p->nConstraint;
  if( whereLoopResize(pParse->db, pNew, nConstraint) ){
    sqlite3DbFree(pParse->db, p);
    return SQLITE_NOMEM_BKPT;
  }

  /* First call xBestIndex() with all constraints usable. */
  WHERETRACE(0x800, ("BEGIN %s.addVirtual()\n", pSrc->pTab->zName));
  WHERETRACE(0x40, ("  VirtualOne: all usable\n"));
  rc = whereLoopAddVirtualOne(pBuilder, mPrereq, ALLBITS, 0, p, mNoOmit, &bIn);

  /* If the call to xBestIndex() with all terms enabled produced a plan
  ** that does not require any source tables (IOW: a plan with mBest==0)
  ** and does not use an IN(...) operator, then there is no point in making 
  ** any further calls to xBestIndex() since they will all return the same
  ** result (if the xBestIndex() implementation is sane). */
  if( rc==SQLITE_OK && ((mBest = (pNew->prereq & ~mPrereq))!=0 || bIn) ){
    int seenZero = 0;             /* True if a plan with no prereqs seen */
    int seenZeroNoIN = 0;         /* Plan with no prereqs and no IN(...) seen */
    Bitmask mPrev = 0;
    Bitmask mBestNoIn = 0;

    /* If the plan produced by the earlier call uses an IN(...) term, call
    ** xBestIndex again, this time with IN(...) terms disabled. */
    if( bIn ){
      WHERETRACE(0x40, ("  VirtualOne: all usable w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, ALLBITS, WO_IN, p, mNoOmit, &bIn);
      assert( bIn==0 );
      mBestNoIn = pNew->prereq & ~mPrereq;
      if( mBestNoIn==0 ){
        seenZero = 1;
        seenZeroNoIN = 1;
      }
    }

    /* Call xBestIndex once for each distinct value of (prereqRight & ~mPrereq) 
    ** in the set of terms that apply to the current virtual table.  */
    while( rc==SQLITE_OK ){
      int i;
      Bitmask mNext = ALLBITS;
      assert( mNext>0 );
      for(i=0; i<nConstraint; i++){
        Bitmask mThis = (
            pWC->a[p->aConstraint[i].iTermOffset].prereqRight & ~mPrereq
        );
        if( mThis>mPrev && mThis<mNext ) mNext = mThis;
      }
      mPrev = mNext;
      if( mNext==ALLBITS ) break;
      if( mNext==mBest || mNext==mBestNoIn ) continue;
      WHERETRACE(0x40, ("  VirtualOne: mPrev=%04llx mNext=%04llx\n",
                       (sqlite3_uint64)mPrev, (sqlite3_uint64)mNext));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mNext|mPrereq, 0, p, mNoOmit, &bIn);
      if( pNew->prereq==mPrereq ){
        seenZero = 1;
        if( bIn==0 ) seenZeroNoIN = 1;
      }
    }

    /* If the calls to xBestIndex() in the above loop did not find a plan
    ** that requires no source tables at all (i.e. one guaranteed to be
    ** usable), make a call here with all source tables disabled */
    if( rc==SQLITE_OK && seenZero==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, 0, p, mNoOmit, &bIn);
      if( bIn==0 ) seenZeroNoIN = 1;
    }

    /* If the calls to xBestIndex() have so far failed to find a plan
    ** that requires no source tables at all and does not use an IN(...)
    ** operator, make a final call to obtain one here.  */
    if( rc==SQLITE_OK && seenZeroNoIN==0 ){
      WHERETRACE(0x40, ("  VirtualOne: all disabled and w/o IN\n"));
      rc = whereLoopAddVirtualOne(
          pBuilder, mPrereq, mPrereq, WO_IN, p, mNoOmit, &bIn);
    }
  }

  if( p->needToFreeIdxStr ) sqlite3_free(p->idxStr);
  sqlite3DbFreeNN(pParse->db, p);
  WHERETRACE(0x800, ("END %s.addVirtual(), rc=%d\n", pSrc->pTab->zName, rc));
  return rc;
}